

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

bool __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::remove_internal
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar1;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this_00;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var6;
  void *in_RDX;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *root_leaf;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aVar7;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_01;
  ulong uVar8;
  byte bVar9;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar10;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_60;
  art_key_type k_local;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> local_50;
  node_ptr *node;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_40;
  undefined4 local_38;
  byte local_31;
  
  this_00 = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)(this->root).tagged_ptr;
  if (this_00 == (basic_leaf<unsigned_long,_unodb::detail::node_header> *)0x0) {
    bVar9 = 0;
  }
  else {
    local_60 = k.field_0;
    local_40 = this;
    if (((ulong)this_00 & 7) == 0) {
      iVar5 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                        (this_00,(void *)k.field_0,in_RDX);
      bVar9 = iVar5 == 0;
      if ((bool)bVar9) {
        local_50._M_value = &local_40->root;
        (local_40->root).tagged_ptr = 0;
        node = (node_ptr *)this_00;
        std::
        unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&local_50);
        bVar9 = 1;
      }
    }
    else {
      aVar7 = k.field_0 >> 8;
      local_38 = SUB84(this,0);
      local_50 = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)this;
      do {
        uVar2 = ((node_ptr *)&(local_50._M_value)->tagged_ptr)->tagged_ptr;
        if ((uVar2 & 7) == 0) {
          __assert_fail("node_type != node_type::LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3f9,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        this_01 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                   *)(uVar2 & 0xfffffffffffffff8);
        kVar1 = this_01[7];
        if (7 < (byte)kVar1) {
          __assert_fail("result <= key_prefix_capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                        ,0x298,
                        "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                       );
        }
        uVar8 = (ulong)k.field_0 & 0xff | aVar7.key << 8;
        k_local.field_0 = aVar7;
        uVar4 = detail::
                key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::get_shared_length(this_01,uVar8);
        if (uVar4 < (byte)kVar1) {
          bVar3 = false;
          local_38 = 0;
          aVar7 = k_local.field_0;
        }
        else {
          if (uVar4 != (byte)kVar1) {
            __assert_fail("shared_prefix_len == key_prefix_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                          ,0x401,
                          "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                         );
          }
          uVar8 = uVar8 >> (((byte)kVar1 & 7) << 3);
          aVar7.key = uVar8 >> 8;
          local_31 = (byte)uVar8;
          oVar10 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                   ::
                   remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                             ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                               *)this_01,(node_type)uVar2 & (I256|I48),&local_31,
                              (basic_art_key<unsigned_long> *)&local_60.key_bytes,local_40,
                              &local_50._M_value);
          _Var6 = oVar10.
                  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
                  ._M_payload;
          if (((undefined1  [16])
               oVar10.
               super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
               ._M_payload.
               super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            bVar3 = false;
            k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                        (uVar8 & 0xffffffff);
            local_38 = 0;
          }
          else {
            bVar3 = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                    _Var6._M_value !=
                    (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0;
            if ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                _Var6._M_value ==
                (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
              local_38 = (undefined4)
                         CONCAT71(oVar10.
                                  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
                                  ._M_payload._1_7_,1);
              k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                          (uVar8 & 0xffffffff);
            }
            else {
              k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
                          (uVar8 >> 8 & 0xffffff);
              aVar7.key = uVar8 >> 0x10;
              bVar3 = true;
              local_50 = _Var6;
            }
          }
        }
      } while (bVar3);
      bVar9 = (byte)local_38;
    }
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool db<Key, Value>::remove_internal(art_key_type k) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return false;

  if (root.type() == node_type::LEAF) {
    auto* const root_leaf{root.ptr<leaf_type*>()};
    if (root_leaf->matches(k)) {
      const auto r{art_policy::reclaim_leaf_on_scope_exit(root_leaf, *this)};
      root = nullptr;
      return true;
    }
    return false;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) return false;

    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto remove_result{inode->template remove_or_choose_subtree<
        std::optional<detail::node_ptr*>>(node_type, remaining_key[0], k, *this,
                                          node)};
    if (UNODB_DETAIL_UNLIKELY(!remove_result)) return false;

    auto* const child_ptr{*remove_result};
    if (child_ptr == nullptr) return true;

    node = child_ptr;
    ++depth;
    remaining_key.shift_right(1);
  }
}